

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Quaternion QuaternionSlerp(Quaternion q1,Quaternion q2,float amount)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Quaternion QVar12;
  
  fVar9 = q2.z;
  fVar11 = q2.w;
  fVar8 = q2.x;
  fVar4 = q2.y;
  fVar7 = q1.z;
  fVar5 = q1.w;
  fVar6 = q1.x;
  fVar3 = q1.y;
  fVar10 = fVar11 * fVar5 + fVar7 * fVar9 + fVar6 * fVar8 + fVar4 * fVar3;
  if (fVar10 < 0.0) {
    fVar8 = -fVar8;
    fVar4 = -fVar4;
    fVar9 = -fVar9;
    fVar10 = -fVar10;
    fVar11 = -fVar11;
  }
  if (ABS(fVar10) < 1.0) {
    if (fVar10 <= 0.95) {
      fVar1 = acosf(fVar10);
      fVar10 = 1.0 - fVar10 * fVar10;
      if (fVar10 < 0.0) {
        fVar10 = sqrtf(fVar10);
      }
      else {
        fVar10 = SQRT(fVar10);
      }
      if (1e-06 <= ABS(fVar10)) {
        fVar2 = sinf((1.0 - amount) * fVar1);
        fVar2 = fVar2 / fVar10;
        fVar1 = sinf(fVar1 * amount);
        fVar1 = fVar1 / fVar10;
        fVar6 = fVar6 * fVar2 + fVar8 * fVar1;
        fVar3 = fVar3 * fVar2 + fVar4 * fVar1;
        fVar7 = fVar7 * fVar2 + fVar9 * fVar1;
        fVar5 = fVar5 * fVar2 + fVar11 * fVar1;
      }
      else {
        fVar6 = fVar6 * 0.5 + fVar8 * 0.5;
        fVar3 = fVar3 * 0.5 + fVar4 * 0.5;
        fVar7 = fVar7 * 0.5 + fVar9 * 0.5;
        fVar5 = fVar5 * 0.5 + fVar11 * 0.5;
      }
    }
    else {
      fVar6 = amount * (fVar8 - fVar6) + fVar6;
      fVar3 = (fVar4 - fVar3) * amount + fVar3;
      fVar7 = amount * (fVar9 - fVar7) + fVar7;
      fVar5 = (fVar11 - fVar5) * amount + fVar5;
      fVar8 = fVar5 * fVar5 + fVar7 * fVar7 + fVar6 * fVar6 + fVar3 * fVar3;
      if (fVar8 < 0.0) {
        fVar8 = sqrtf(fVar8);
      }
      else {
        fVar8 = SQRT(fVar8);
      }
      fVar8 = (float)(-(uint)(fVar8 == 0.0) & 0x3f800000 |
                     ~-(uint)(fVar8 == 0.0) & (uint)(1.0 / fVar8));
      fVar6 = fVar6 * fVar8;
      fVar3 = fVar3 * fVar8;
      fVar7 = fVar7 * fVar8;
      fVar5 = fVar5 * fVar8;
    }
  }
  QVar12.y = fVar3;
  QVar12.x = fVar6;
  QVar12.w = fVar5;
  QVar12.z = fVar7;
  return QVar12;
}

Assistant:

RMAPI Quaternion QuaternionSlerp(Quaternion q1, Quaternion q2, float amount)
{
    Quaternion result = { 0 };

#if !defined(EPSILON)
    #define EPSILON 0.000001f
#endif

    float cosHalfTheta = q1.x*q2.x + q1.y*q2.y + q1.z*q2.z + q1.w*q2.w;

    if (cosHalfTheta < 0)
    {
        q2.x = -q2.x; q2.y = -q2.y; q2.z = -q2.z; q2.w = -q2.w;
        cosHalfTheta = -cosHalfTheta;
    }

    if (fabsf(cosHalfTheta) >= 1.0f) result = q1;
    else if (cosHalfTheta > 0.95f) result = QuaternionNlerp(q1, q2, amount);
    else
    {
        float halfTheta = acosf(cosHalfTheta);
        float sinHalfTheta = sqrtf(1.0f - cosHalfTheta*cosHalfTheta);

        if (fabsf(sinHalfTheta) < EPSILON)
        {
            result.x = (q1.x*0.5f + q2.x*0.5f);
            result.y = (q1.y*0.5f + q2.y*0.5f);
            result.z = (q1.z*0.5f + q2.z*0.5f);
            result.w = (q1.w*0.5f + q2.w*0.5f);
        }
        else
        {
            float ratioA = sinf((1 - amount)*halfTheta)/sinHalfTheta;
            float ratioB = sinf(amount*halfTheta)/sinHalfTheta;

            result.x = (q1.x*ratioA + q2.x*ratioB);
            result.y = (q1.y*ratioA + q2.y*ratioB);
            result.z = (q1.z*ratioA + q2.z*ratioB);
            result.w = (q1.w*ratioA + q2.w*ratioB);
        }
    }

    return result;
}